

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

xmlParserErrors
xmlParserInputBufferCreateUrl
          (char *URI,xmlCharEncoding enc,xmlParserInputFlags flags,xmlParserInputBufferPtr *out)

{
  code *pcVar1;
  xmlInputCloseCallback p_Var2;
  int iVar3;
  xmlParserErrors xVar4;
  xmlParserInputBufferPtr buf;
  void *pvVar5;
  xmlParserInputFlags flags_00;
  int *piVar6;
  ulong uVar7;
  int fd;
  
  xmlInitParser();
  *out = (xmlParserInputBufferPtr)0x0;
  if (URI == (char *)0x0) {
    xVar4 = XML_ERR_ARGUMENT;
  }
  else {
    buf = xmlAllocParserInputBuffer(enc);
    if (buf == (xmlParserInputBufferPtr)0x0) {
      xVar4 = XML_ERR_NO_MEMORY;
    }
    else {
      uVar7 = (ulong)(uint)xmlInputCallbackNr;
      piVar6 = &xmlInputCallbackNr + uVar7 * 8;
      for (; 0 < (int)uVar7; uVar7 = (ulong)((int)uVar7 - 1)) {
        pcVar1 = *(code **)(piVar6 + -4);
        if (pcVar1 == xmlIODefaultMatch) {
          xVar4 = xmlFdOpen(URI,0,&fd);
          iVar3 = fd;
          if (xVar4 == XML_ERR_OK) {
            xVar4 = xmlInputFromFd(buf,fd,flags_00);
            close(iVar3);
          }
          if (xVar4 != XML_IO_ENOENT) {
            if (xVar4 == XML_ERR_OK) goto LAB_00156e08;
            goto LAB_00156de7;
          }
        }
        else if ((pcVar1 != (code *)0x0) && (iVar3 = (*pcVar1)(URI), iVar3 != 0)) {
          pvVar5 = (void *)(**(code **)(piVar6 + -2))(URI);
          buf->context = pvVar5;
          if (pvVar5 != (void *)0x0) {
            p_Var2 = *(xmlInputCloseCallback *)(piVar6 + 2);
            buf->readcallback = *(xmlInputReadCallback *)piVar6;
            buf->closecallback = p_Var2;
            xVar4 = XML_ERR_OK;
            goto LAB_00156e08;
          }
        }
        piVar6 = piVar6 + -8;
      }
      xVar4 = XML_IO_ENOENT;
LAB_00156de7:
      xmlFreeParserInputBuffer(buf);
      buf = (xmlParserInputBufferPtr)0x0;
LAB_00156e08:
      *out = buf;
    }
  }
  return xVar4;
}

Assistant:

xmlParserErrors
xmlParserInputBufferCreateUrl(const char *URI, xmlCharEncoding enc,
                              xmlParserInputFlags flags,
                              xmlParserInputBufferPtr *out) {
    xmlParserInputBufferPtr buf;
    xmlParserErrors ret;
    int i;

    xmlInitParser();

    *out = NULL;
    if (URI == NULL)
        return(XML_ERR_ARGUMENT);

    /*
     * Allocate the Input buffer front-end.
     */
    buf = xmlAllocParserInputBuffer(enc);
    if (buf == NULL)
        return(XML_ERR_NO_MEMORY);

    /*
     * Try to find one of the input accept method accepting that scheme
     * Go in reverse to give precedence to user defined handlers.
     */
    ret = XML_IO_ENOENT;
    for (i = xmlInputCallbackNr - 1; i >= 0; i--) {
        xmlInputCallback *cb = &xmlInputCallbackTable[i];

        if (cb->matchcallback == xmlIODefaultMatch) {
            ret = xmlInputDefaultOpen(buf, URI, flags);

            if ((ret == XML_ERR_OK) || (ret != XML_IO_ENOENT))
                break;
        } else if ((cb->matchcallback != NULL) &&
                   (cb->matchcallback(URI) != 0)) {
            buf->context = cb->opencallback(URI);
            if (buf->context != NULL) {
                buf->readcallback = cb->readcallback;
                buf->closecallback = cb->closecallback;
                ret = XML_ERR_OK;
                break;
            }
        }
    }
    if (ret != XML_ERR_OK) {
        xmlFreeParserInputBuffer(buf);
        *out = NULL;
	return(ret);
    }

    *out = buf;
    return(ret);
}